

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O1

void __thiscall CfdLogger_WriteLog_Test::TestBody(CfdLogger_WriteLog_Test *this)

{
  bool bVar1;
  CfdSourceLocation loc;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [16];
  CfdSourceLocation local_28;
  
  local_28.funcname = "";
  local_28.filename = "";
  local_28.line = 0;
  local_28._12_4_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48[0].ptr_ = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
      cfd::core::logger::WriteLog(&local_28,kCfdLogLevelInfo,(string *)local_48);
      if (local_48[0].ptr_ != local_38) {
        operator_delete(local_48[0].ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x16,
               "Expected: (WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, \"\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (((local_48[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST(CfdLogger, WriteLog) {
  CfdSourceLocation loc {"", 0, ""};
  EXPECT_NO_THROW((WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, "")));
}